

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O2

int pstore::broker::shutdown(int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  undefined7 extraout_var;
  int in_ECX;
  int in_EDX;
  int __how_00;
  int iVar2;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  command_processor *pcVar3;
  maybe<pstore::http::server_status,_void> *in_R8;
  undefined1 *in_R9;
  double __x;
  double __x_00;
  allocator local_82;
  bool expected;
  not_null<pstore::broker::command_processor_*> local_80;
  undefined1 *local_78;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_70;
  not_null<pstore::broker::command_processor_*> local_68;
  string local_60;
  not_null<const_char_*> local_40;
  not_null<const_char_*> local_38;
  
  pcVar3 = (command_processor *)CONCAT44(in_register_0000003c,__fd);
  expected = false;
  local_70.ptr_ = in_R8;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)&done,&expected,true,memory_order_seq_cst);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"pstore broker is exiting.\n");
    local_38.ptr_ = "performing shutdown";
    gsl::not_null<const_char_*>::ensure_invariant(&local_38);
    iVar2 = (int)local_38.ptr_;
    pstore::log((pstore *)0x6,__x);
    gc_sigint(in_EDX);
    if ((scavenger *)CONCAT44(in_register_00000034,__how) != (scavenger *)0x0) {
      scavenger::shutdown((scavenger *)CONCAT44(in_register_00000034,__how),iVar2,__how_00);
    }
    if (pcVar3 != (command_processor *)0x0) {
      local_78 = in_R9;
      while (bVar1 = in_ECX != 0, in_ECX = in_ECX + -1, bVar1) {
        local_80.ptr_ = pcVar3;
        gsl::not_null<pstore::broker::command_processor_*>::ensure_invariant(&local_80);
        std::__cxx11::string::string((string *)&local_60,"_QUIT",&local_82);
        anon_unknown.dwarf_177be1::push
                  ((not_null<pstore::broker::command_processor_*>)local_80.ptr_,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      local_68.ptr_ = pcVar3;
      gsl::not_null<pstore::broker::command_processor_*>::ensure_invariant(&local_68);
      std::__cxx11::string::string((string *)&local_60,"_CQUIT",&local_82);
      anon_unknown.dwarf_177be1::push
                ((not_null<pstore::broker::command_processor_*>)local_68.ptr_,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      in_R9 = local_78;
    }
    http::quit(local_70);
    LOCK();
    *in_R9 = 1;
    UNLOCK();
    local_40.ptr_ = "shutdown requests complete";
    gsl::not_null<const_char_*>::ensure_invariant(&local_40);
    pstore::log((pstore *)0x6,__x_00);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void shutdown (command_processor * const cp, scavenger * const scav, int const signum,
                       unsigned const num_read_threads,
                       not_null<maybe<pstore::http::server_status> *> const http_status,
                       not_null<std::atomic<bool> *> const uptime_done) {

            // Set the global "done" flag unless we're already shutting down. The latter condition
            // happens if a "SUICIDE" command is received and the quit thread is woken in response.
            bool expected = false;
            if (done.compare_exchange_strong (expected, true)) {
                std::cerr << "pstore broker is exiting.\n";
                log (priority::info, "performing shutdown");

                // Tell the gcwatcher thread to exit.
                broker::gc_sigint (signum);

                if (scav != nullptr) {
                    scav->shutdown ();
                }

                if (cp != nullptr) {
                    // Ask the read-loop threads to quit
                    for (auto ctr = 0U; ctr < num_read_threads; ++ctr) {
                        push (cp, read_loop_quit_command);
                    }
                    // Finally ask the command loop thread to exit.
                    push (cp, command_loop_quit_command);
                }

                pstore::http::quit (http_status);
                *uptime_done = true;

                log (priority::info, "shutdown requests complete");
            }
        }